

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall
QTextDocumentPrivate::clearUndoRedoStacks
          (QTextDocumentPrivate *this,Stacks stacksToClear,bool emitSignals)

{
  QList<QTextUndoCommand> *this_00;
  QTextUndoCommand *pQVar1;
  long *plVar2;
  Data *pDVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar4 = this->undoState;
  this_00 = &this->undoStack;
  if (stacksToClear == UndoStack && iVar4 != 0) {
    iVar4 = this->undoState;
    if (0 < iVar4) {
      lVar8 = 0x10;
      lVar6 = 0;
      do {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + lVar8);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar8 + -0xf) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
        }
        lVar6 = lVar6 + 1;
        iVar4 = this->undoState;
        lVar8 = lVar8 + 0x20;
      } while (lVar6 < iVar4);
    }
    if (iVar4 != 0) {
      pDVar3 = (this_00->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QTextUndoCommand>::reallocateAndGrow
                  (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QTextUndoCommand> *)0x0);
      }
      QtPrivate::QPodArrayOps<QTextUndoCommand>::erase
                ((QPodArrayOps<QTextUndoCommand> *)this_00,(this->undoStack).d.ptr,(long)iVar4);
    }
    this->undoState = 0;
    if (!emitSignals) {
      return;
    }
    if (this->wasUndoAvailable == false) {
      return;
    }
    QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,false);
    this->wasUndoAvailable = false;
    return;
  }
  lVar8 = (long)iVar4;
  lVar6 = (this->undoStack).d.size;
  if (stacksToClear == RedoStack && lVar6 != lVar8) {
    if (lVar8 < (this->undoStack).d.size) {
      uVar5 = lVar8 << 5 | 0x10;
      do {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + uVar5);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + (uVar5 - 0xf)) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
        }
        lVar8 = lVar8 + 1;
        uVar5 = uVar5 + 0x20;
      } while (lVar8 < (this->undoStack).d.size);
    }
    QList<QTextUndoCommand>::resize(this_00,(long)this->undoState);
    if (!emitSignals) {
      return;
    }
  }
  else {
    if (lVar6 == 0 || stacksToClear != UndoAndRedoStacks) {
      return;
    }
    if ((this->undoStack).d.size != 0) {
      lVar7 = 0x10;
      uVar5 = 0;
      do {
        pQVar1 = (this->undoStack).d.ptr;
        plVar2 = *(long **)((long)&pQVar1->command + lVar7);
        if (plVar2 != (long *)0x0 && (*(byte *)((long)pQVar1 + lVar7 + -0xf) & 1) != 0) {
          (**(code **)(*plVar2 + 8))();
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar5 < (ulong)(this->undoStack).d.size);
    }
    this->undoState = 0;
    QList<QTextUndoCommand>::clear(this_00);
    if ((iVar4 != 0 && emitSignals) && (this->wasUndoAvailable != false)) {
      QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,false);
      this->wasUndoAvailable = false;
    }
    if (!emitSignals || lVar6 == lVar8) {
      return;
    }
  }
  if (this->wasRedoAvailable != false) {
    QTextDocument::redoAvailable(*(QTextDocument **)&this->field_0x8,false);
    this->wasRedoAvailable = false;
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clearUndoRedoStacks(QTextDocument::Stacks stacksToClear,
                                               bool emitSignals)
{
    bool undoCommandsAvailable = undoState != 0;
    bool redoCommandsAvailable = undoState != undoStack.size();
    if (stacksToClear == QTextDocument::UndoStack && undoCommandsAvailable) {
        for (int i = 0; i < undoState; ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.remove(0, undoState);
        undoState = 0;
        if (emitSignals)
            emitUndoAvailable(false);
    } else if (stacksToClear == QTextDocument::RedoStack
               && redoCommandsAvailable) {
        for (int i = undoState; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.resize(undoState);
        if (emitSignals)
            emitRedoAvailable(false);
    } else if (stacksToClear == QTextDocument::UndoAndRedoStacks
               && !undoStack.isEmpty()) {
        for (int i = 0; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoState = 0;
        undoStack.clear();
        if (emitSignals && undoCommandsAvailable)
            emitUndoAvailable(false);
        if (emitSignals && redoCommandsAvailable)
            emitRedoAvailable(false);
    }
}